

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall sector_t::GetFriction(sector_t *this,int plane,double *pMoveFac)

{
  FTerrainDef *pFVar1;
  uint uVar2;
  double dVar3;
  
  if ((this->Flags & 0x10) == 0) {
    uVar2 = GetTerrain(this,plane);
    pFVar1 = Terrains.Array;
    dVar3 = Terrains.Array[uVar2].Friction;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      if (pMoveFac != (double *)0x0) {
        *pMoveFac = Terrains.Array[uVar2].MoveFactor;
        dVar3 = pFVar1[uVar2].Friction;
      }
    }
    else {
      dVar3 = 0.90625;
      if (pMoveFac != (double *)0x0) {
        *pMoveFac = 0.03125;
      }
    }
  }
  else {
    if (pMoveFac != (double *)0x0) {
      *pMoveFac = this->movefactor;
    }
    dVar3 = this->friction;
  }
  return dVar3;
}

Assistant:

double sector_t::GetFriction(int plane, double *pMoveFac) const
{
	if (Flags & SECF_FRICTION) 
	{ 
		if (pMoveFac) *pMoveFac = movefactor;
		return friction; 
	}
	FTerrainDef *terrain = &Terrains[GetTerrain(plane)];
	if (terrain->Friction != 0)
	{
		if (pMoveFac) *pMoveFac = terrain->MoveFactor;
		return terrain->Friction;
	}
	else
	{
		if (pMoveFac) *pMoveFac = ORIG_FRICTION_FACTOR;
		return ORIG_FRICTION;
	}
}